

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-encoder.c
# Opt level: O3

int mg_session_send_pull_message(mg_session *session,mg_map *extra)

{
  undefined4 in_EAX;
  int iVar1;
  undefined4 in_register_00000004;
  undefined8 uStack_18;
  
  uStack_18._7_1_ = (undefined1)((uint)in_register_00000004 >> 0x18);
  uStack_18._0_6_ = (undefined6)CONCAT44(in_register_00000004,in_EAX);
  uStack_18 = CONCAT17(uStack_18._7_1_,CONCAT16(session->version == 4,(undefined6)uStack_18)) |
              0xb0000000000000;
  iVar1 = mg_session_write_raw(session,(char *)((long)&uStack_18 + 6),1);
  if (iVar1 == 0) {
    uStack_18 = CONCAT17(0x3f,(undefined7)uStack_18);
    iVar1 = mg_session_write_raw(session,(char *)((long)&uStack_18 + 7),1);
    if (iVar1 == 0) {
      if ((session->version == 4) && (iVar1 = mg_session_write_map(session,extra), iVar1 != 0)) {
        return iVar1;
      }
      iVar1 = mg_session_flush_message(session);
    }
  }
  return iVar1;
}

Assistant:

int mg_session_send_pull_message(mg_session *session, const mg_map *extra) {
  uint8_t marker = MG_MARKER_TINY_STRUCT + (session->version == 4);
  MG_RETURN_IF_FAILED(mg_session_write_uint8(session, marker));
  MG_RETURN_IF_FAILED(
      mg_session_write_uint8(session, MG_SIGNATURE_MESSAGE_PULL));

  if (session->version == 4) {
    MG_RETURN_IF_FAILED(mg_session_write_map(session, extra));
  }

  return mg_session_flush_message(session);
}